

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::Merge(Parser *this,ZeroCopyInputStream *input,Message *output)

{
  bool bVar1;
  uint uVar2;
  ParserImpl *in_RDI;
  ParserImpl parser;
  undefined4 local_1b8 [2];
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  undefined1 in_stack_fffffffffffffe6c;
  undefined1 in_stack_fffffffffffffe6d;
  undefined1 in_stack_fffffffffffffe6e;
  undefined1 in_stack_fffffffffffffe6f;
  undefined4 in_stack_fffffffffffffe74;
  undefined4 in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe84;
  undefined4 in_stack_fffffffffffffe8c;
  ParserImpl *in_stack_fffffffffffffec0;
  Message *in_stack_fffffffffffffec8;
  SingularOverwritePolicy in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  Parser *in_stack_fffffffffffffed8;
  int in_stack_ffffffffffffff10;
  
  Message::GetDescriptor((Message *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  uVar2 = *(byte *)((long)&(in_RDI->tokenizer_error_collector_).super_ErrorCollector.
                           _vptr_ErrorCollector + 1) & 1;
  local_1b8[0] = 0;
  ParserImpl::ParserImpl
            (in_RDI,(Descriptor *)local_1b8,
             (ZeroCopyInputStream *)
             CONCAT44(in_stack_fffffffffffffe8c,
                      *(undefined4 *)&(in_RDI->tokenizer_error_collector_).parser_),
             (ErrorCollector *)
             (CONCAT44(in_stack_fffffffffffffe84,
                       (uint)*(byte *)&(in_RDI->tokenizer_error_collector_).super_ErrorCollector.
                                       _vptr_ErrorCollector) & 0xffffffff00000001),
             (Finder *)
             (CONCAT44(in_stack_fffffffffffffe7c,
                       (uint)*(byte *)((long)&(in_RDI->tokenizer_error_collector_).
                                              super_ErrorCollector._vptr_ErrorCollector + 6)) &
             0xffffffff00000001),
             (ParseInfoTree *)
             (CONCAT44(in_stack_fffffffffffffe74,
                       (uint)*(byte *)((long)&(in_RDI->tokenizer_error_collector_).
                                              super_ErrorCollector._vptr_ErrorCollector + 5)) &
             0xffffffff00000001),in_stack_fffffffffffffed0,(bool)in_stack_fffffffffffffe6f,
             (bool)in_stack_fffffffffffffe6e,(bool)in_stack_fffffffffffffe6d,
             (bool)in_stack_fffffffffffffe6c,false,false,false,in_stack_ffffffffffffff10);
  bVar1 = MergeUsingImpl(in_stack_fffffffffffffed8,
                         (ZeroCopyInputStream *)
                         CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                         in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  ParserImpl::~ParserImpl((ParserImpl *)CONCAT44(in_stack_fffffffffffffe54,uVar2));
  return bVar1;
}

Assistant:

bool TextFormat::Parser::Merge(io::ZeroCopyInputStream* input,
                               Message* output) {
  ParserImpl parser(output->GetDescriptor(), input, error_collector_, finder_,
                    parse_info_tree_, ParserImpl::ALLOW_SINGULAR_OVERWRITES,
                    allow_case_insensitive_field_, allow_unknown_field_,
                    allow_unknown_extension_, allow_unknown_enum_,
                    allow_field_number_, allow_relaxed_whitespace_,
                    allow_partial_, recursion_limit_);
  return MergeUsingImpl(input, output, &parser);
}